

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlChar * xmlXPathNsLookup(xmlXPathContextPtr ctxt,xmlChar *prefix)

{
  int iVar1;
  char *pcVar2;
  xmlChar *pxVar3;
  long lVar4;
  
  if (prefix == (xmlChar *)0x0 || ctxt == (xmlXPathContextPtr)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    iVar1 = xmlStrEqual(prefix,(xmlChar *)"xml");
    if (iVar1 == 0) {
      if (ctxt->namespaces != (xmlNsPtr *)0x0) {
        for (lVar4 = 0; lVar4 < ctxt->nsNr; lVar4 = lVar4 + 1) {
          if ((ctxt->namespaces[lVar4] != (xmlNsPtr)0x0) &&
             (iVar1 = xmlStrEqual(ctxt->namespaces[lVar4]->prefix,prefix), iVar1 != 0)) {
            return ctxt->namespaces[lVar4]->href;
          }
        }
      }
      pxVar3 = (xmlChar *)xmlHashLookup(ctxt->nsHash,prefix);
      return pxVar3;
    }
    pcVar2 = "http://www.w3.org/XML/1998/namespace";
  }
  return (xmlChar *)pcVar2;
}

Assistant:

const xmlChar *
xmlXPathNsLookup(xmlXPathContextPtr ctxt, const xmlChar *prefix) {
    if (ctxt == NULL)
	return(NULL);
    if (prefix == NULL)
	return(NULL);

    if (xmlStrEqual(prefix, (const xmlChar *) "xml"))
	return(XML_XML_NAMESPACE);

    if (ctxt->namespaces != NULL) {
	int i;

	for (i = 0;i < ctxt->nsNr;i++) {
	    if ((ctxt->namespaces[i] != NULL) &&
		(xmlStrEqual(ctxt->namespaces[i]->prefix, prefix)))
		return(ctxt->namespaces[i]->href);
	}
    }

    return((const xmlChar *) xmlHashLookup(ctxt->nsHash, prefix));
}